

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

MessageType __thiscall cmMessenger::ConvertMessageType(cmMessenger *this,MessageType t)

{
  bool bVar1;
  MessageType local_14;
  bool warningsAsErrors;
  MessageType t_local;
  cmMessenger *this_local;
  
  local_14 = t;
  if ((t == AUTHOR_WARNING) || (t == AUTHOR_ERROR)) {
    bVar1 = GetDevWarningsAsErrors(this);
    if ((bVar1) && (t == AUTHOR_WARNING)) {
      local_14 = AUTHOR_ERROR;
    }
    else if ((!bVar1) && (t == AUTHOR_ERROR)) {
      local_14 = AUTHOR_WARNING;
    }
  }
  else if ((t == DEPRECATION_WARNING) || (t == DEPRECATION_ERROR)) {
    bVar1 = GetDeprecatedWarningsAsErrors(this);
    if ((bVar1) && (t == DEPRECATION_WARNING)) {
      local_14 = DEPRECATION_ERROR;
    }
    else if ((!bVar1) && (t == DEPRECATION_ERROR)) {
      local_14 = DEPRECATION_WARNING;
    }
  }
  return local_14;
}

Assistant:

MessageType cmMessenger::ConvertMessageType(MessageType t) const
{
  bool warningsAsErrors;

  if (t == MessageType::AUTHOR_WARNING || t == MessageType::AUTHOR_ERROR) {
    warningsAsErrors = this->GetDevWarningsAsErrors();
    if (warningsAsErrors && t == MessageType::AUTHOR_WARNING) {
      t = MessageType::AUTHOR_ERROR;
    } else if (!warningsAsErrors && t == MessageType::AUTHOR_ERROR) {
      t = MessageType::AUTHOR_WARNING;
    }
  } else if (t == MessageType::DEPRECATION_WARNING ||
             t == MessageType::DEPRECATION_ERROR) {
    warningsAsErrors = this->GetDeprecatedWarningsAsErrors();
    if (warningsAsErrors && t == MessageType::DEPRECATION_WARNING) {
      t = MessageType::DEPRECATION_ERROR;
    } else if (!warningsAsErrors && t == MessageType::DEPRECATION_ERROR) {
      t = MessageType::DEPRECATION_WARNING;
    }
  }

  return t;
}